

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt_env_infrastructure.cpp
# Opt level: O2

void __thiscall
so_5::env_infrastructures::default_mt::impl::coop_repo_t::wait_for_start_deregistration
          (coop_repo_t *this)

{
  unique_lock<std::mutex> lck;
  unique_lock<std::mutex> uStack_28;
  
  std::unique_lock<std::mutex>::unique_lock
            (&uStack_28,&(this->super_coop_repository_basis_t).m_coop_operations_lock);
  while ((this->super_coop_repository_basis_t).m_deregistration_started == false) {
    std::condition_variable::wait((unique_lock *)&this->m_deregistration_started_cond);
  }
  std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  return;
}

Assistant:

void
coop_repo_t::wait_for_start_deregistration()
{
	std::unique_lock< std::mutex > lck( this->lock() );

	m_deregistration_started_cond.wait( lck,
			[this] { return m_deregistration_started; } );
}